

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_312651::Handlers::beginArray
          (Handlers *this,json_handler_t *start_fn,bare_handler_t *end_fn)

{
  JSONHandler *pJVar1;
  element_type *peVar2;
  shared_ptr<JSONHandler> local_e0;
  shared_ptr<JSONHandler> local_d0;
  function<void_()> local_c0;
  void_handler_t local_a0;
  function<void_(JSON)> local_70;
  json_handler_t local_50;
  undefined1 local_30 [8];
  shared_ptr<JSONHandler> item_jh;
  bare_handler_t *end_fn_local;
  json_handler_t *start_fn_local;
  Handlers *this_local;
  
  item_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)end_fn;
  std::make_shared<JSONHandler>();
  pJVar1 = this->jh;
  std::function<void_(JSON)>::function(&local_70,start_fn);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<(anonymous_namespace)::Handlers::beginArray(std::function<void(JSON)>,std::function<void()>)::__0,void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_50,
             (anon_class_32_1_3668df43 *)&local_70);
  std::function<void_()>::function(&local_c0,end_fn);
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::beginArray(std::function<void(JSON)>,std::function<void()>)::__1,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_a0,
             (anon_class_32_1_53ba67ea *)&local_c0);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_d0,(shared_ptr<JSONHandler> *)local_30);
  JSONHandler::addArrayHandlers(pJVar1,&local_50,&local_a0,&local_d0);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_d0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a0);
  (anonymous_namespace)::Handlers::beginArray(std::function<void(JSON)>,std::function<void()>)::$_1
  ::~__1((__1 *)&local_c0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_50);
  (anonymous_namespace)::Handlers::beginArray(std::function<void(JSON)>,std::function<void()>)::$_0
  ::~__0((__0 *)&local_70);
  pJVar1 = this->jh;
  std::shared_ptr<JSONHandler>::shared_ptr(&local_e0,(shared_ptr<JSONHandler> *)local_30);
  JSONHandler::addFallbackHandler(pJVar1,&local_e0);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_e0);
  peVar2 = std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  this->jh = peVar2;
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)local_30);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_30);
  return;
}

Assistant:

void
Handlers::beginArray(json_handler_t start_fn, bare_handler_t end_fn)
{
    auto item_jh = std::make_shared<JSONHandler>();
    jh->addArrayHandlers(
        [start_fn](std::string const&, JSON j) { start_fn(j); },
        [end_fn](std::string const&) { end_fn(); },
        item_jh);
    jh->addFallbackHandler(item_jh);
    this->jh = item_jh.get();
    this->json_handlers.emplace_back(std::move(item_jh));
}